

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_thread.h
# Opt level: O2

void DrawerCommandQueue::QueueCommand<swrenderer::DrawWallMasked4PalCommand>(void)

{
  DrawerCommandQueue *this;
  DrawWallMasked4PalCommand *this_00;
  DrawWallMasked4PalCommand command;
  DrawWallMasked4PalCommand local_a8;
  
  this = Instance();
  if ((this->threaded_render == 0) || (r_multithreaded.Value == false)) {
    memset(&local_a8,0,0x98);
    swrenderer::DrawWallMasked4PalCommand::DrawWallMasked4PalCommand(&local_a8);
    VectoredTryCatch(&local_a8,
                     QueueCommand<swrenderer::DrawWallMasked4PalCommand>::anon_class_1_0_00000001::
                     __invoke,QueueCommand<swrenderer::DrawWallMasked4PalCommand>::
                              anon_class_1_0_00000001::__invoke);
  }
  else {
    this_00 = (DrawWallMasked4PalCommand *)AllocMemory(0x98);
    if (this_00 == (DrawWallMasked4PalCommand *)0x0) {
      Finish(this);
      this_00 = (DrawWallMasked4PalCommand *)AllocMemory(0x98);
      if (this_00 == (DrawWallMasked4PalCommand *)0x0) {
        return;
      }
    }
    memset(this_00,0,0x98);
    swrenderer::DrawWallMasked4PalCommand::DrawWallMasked4PalCommand(this_00);
    local_a8.super_PalWall4Command.super_DrawerCommand._vptr_DrawerCommand = (_func_int **)this_00;
    std::vector<DrawerCommand*,std::allocator<DrawerCommand*>>::emplace_back<DrawerCommand*>
              ((vector<DrawerCommand*,std::allocator<DrawerCommand*>> *)&this->commands,
               (DrawerCommand **)&local_a8);
  }
  return;
}

Assistant:

static void QueueCommand(Types &&... args)
	{
		auto queue = Instance();
		if (queue->threaded_render == 0 || !r_multithreaded)
		{
			T command(std::forward<Types>(args)...);
			VectoredTryCatch(&command,
			[](void *data)
			{
				T *c = (T*)data;
				c->Execute(&Instance()->single_core_thread);
			},
			[](void *data, const char *reason, bool fatal)
			{
				T *c = (T*)data;
				ReportDrawerError(c, false, reason, fatal);
			});
		}
		else
		{
			void *ptr = AllocMemory(sizeof(T));
			if (!ptr) // Out of memory - render what we got
			{
				queue->Finish();
				ptr = AllocMemory(sizeof(T));
				if (!ptr)
					return;
			}
			T *command = new (ptr)T(std::forward<Types>(args)...);
			queue->commands.push_back(command);
		}
	}